

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitTableGrow(FunctionValidator *this,TableGrow *curr)

{
  bool *pbVar1;
  bool bVar2;
  Module *pMVar3;
  bool local_59;
  Type local_58;
  Type local_50;
  uintptr_t local_48;
  uintptr_t local_40;
  BasicType local_34;
  undefined8 local_30;
  size_t local_28;
  Table *local_20;
  Table *table;
  TableGrow *curr_local;
  FunctionValidator *this_local;
  
  table = (Table *)curr;
  curr_local = (TableGrow *)this;
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar2 = FeatureSet::hasReferenceTypes(&pMVar3->features);
  shouldBeTrue<wasm::TableGrow*>
            (this,bVar2,(TableGrow *)table,
             "table.grow requires reference types [--enable-reference-types]");
  pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  pbVar1 = &(table->super_Importable).super_Named.hasExplicitName;
  local_30 = *(undefined8 *)pbVar1;
  local_28 = (table->super_Importable).module.super_IString.str._M_len;
  local_20 = Module::getTableOrNull(pMVar3,(IString)*(IString *)pbVar1);
  bVar2 = shouldBeTrue<wasm::TableGrow*>
                    (this,local_20 != (Table *)0x0,(TableGrow *)table,"table.grow table must exist")
  ;
  local_59 = false;
  if (bVar2) {
    local_34 = unreachable;
    local_59 = wasm::Type::operator!=
                         ((Type *)&(table->super_Importable).super_Named.name.super_IString.str.
                                   _M_str,&local_34);
  }
  if (local_59 != false) {
    local_40 = *(uintptr_t *)((table->super_Importable).module.super_IString.str._M_str + 8);
    local_48 = (local_20->type).id;
    shouldBeSubType(this,(Type)local_40,(Type)local_48,(Expression *)table,
                    "table.grow value must have right type");
    local_50.id = *(uintptr_t *)((table->super_Importable).base.super_IString.str._M_len + 8);
    wasm::Type::Type(&local_58,i32);
    shouldBeEqual<wasm::TableGrow*,wasm::Type>
              (this,local_50,local_58,(TableGrow *)table,"table.grow must match table index type");
  }
  return;
}

Assistant:

void FunctionValidator::visitTableGrow(TableGrow* curr) {
  shouldBeTrue(
    getModule()->features.hasReferenceTypes(),
    curr,
    "table.grow requires reference types [--enable-reference-types]");
  auto* table = getModule()->getTableOrNull(curr->table);
  if (shouldBeTrue(!!table, curr, "table.grow table must exist") &&
      curr->type != Type::unreachable) {
    shouldBeSubType(curr->value->type,
                    table->type,
                    curr,
                    "table.grow value must have right type");
    shouldBeEqual(curr->delta->type,
                  Type(Type::i32),
                  curr,
                  "table.grow must match table index type");
  }
}